

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O2

bool __thiscall
YAML::EmitterState::SetOutputCharset(EmitterState *this,EMITTER_MANIP value,value scope)

{
  if (value - EmitNonAscii < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_charset,value,scope);
  }
  return value - EmitNonAscii < 3;
}

Assistant:

bool EmitterState::SetOutputCharset(EMITTER_MANIP value,
                                    FmtScope::value scope) {
  switch (value) {
    case EmitNonAscii:
    case EscapeNonAscii:
    case EscapeAsJson:
      _Set(m_charset, value, scope);
      return true;
    default:
      return false;
  }
}